

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

int array_negation_range_test(int r_start,int r_end,_Bool is_bitset)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  int iVar3;
  int extraout_EAX;
  uint16_t *carr;
  array_container_t *container;
  uint16_t *puVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  unsigned_long a;
  uint uVar11;
  ushort uVar12;
  ushort uVar13;
  int x;
  uint uVar14;
  int32_t iVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  container_t *BO;
  uint *local_48;
  int local_3c;
  ulong local_38;
  
  container = array_container_create();
  iVar15 = container->cardinality;
  uVar14 = 0;
  local_3c = r_start;
  do {
    uVar12 = (ushort)uVar14;
    if ((iVar15 == 0) ||
       ((puVar4 = container->array, iVar15 != 0x7fffffff && (puVar4[(long)iVar15 + -1] < uVar12))))
    {
      if (iVar15 == container->capacity) {
        array_container_grow(container,iVar15 + 1,true);
        iVar15 = container->cardinality;
      }
      container->cardinality = iVar15 + 1;
      container->array[iVar15] = uVar12;
      iVar3 = iVar15 + 1;
    }
    else {
      if (iVar15 < 1) {
        uVar6 = 0;
      }
      else {
        iVar3 = iVar15 + -1;
        uVar6 = 0;
        do {
          uVar7 = iVar3 + (int)uVar6;
          uVar8 = uVar7 >> 1;
          uVar13 = *(ushort *)((long)puVar4 + (ulong)(uVar7 & 0xfffffffe));
          if (uVar13 < uVar12) {
            uVar6 = (ulong)(uVar8 + 1);
          }
          else {
            iVar3 = iVar15;
            if (uVar13 <= uVar12) goto LAB_001095b5;
            iVar3 = uVar8 - 1;
          }
        } while ((int)uVar6 <= iVar3);
        iVar3 = 0x7fffffff;
        if (iVar15 == 0x7fffffff) goto LAB_001095b5;
      }
      if (iVar15 == container->capacity) {
        array_container_grow(container,iVar15 + 1,true);
        puVar4 = container->array;
      }
      memmove(puVar4 + uVar6 + 1,puVar4 + uVar6,(long)(iVar15 - (int)uVar6) * 2);
      container->array[uVar6] = uVar12;
      iVar3 = container->cardinality + 1;
      container->cardinality = iVar3;
      r_start = local_3c;
    }
LAB_001095b5:
    iVar15 = iVar3;
    bVar16 = uVar14 < 0xffe3;
    uVar14 = uVar14 + 0x1d;
  } while (bVar16);
  sVar21 = 0;
  sVar22 = 1;
  sVar23 = 2;
  sVar24 = 3;
  iVar25 = 0;
  iVar26 = 1;
  iVar27 = 2;
  iVar28 = 3;
  iVar17 = 0;
  iVar18 = 0;
  iVar19 = 0;
  iVar20 = 0;
  iVar3 = 0x10000;
  do {
    auVar29._0_4_ = -(uint)(iVar25 < r_start);
    auVar29._4_4_ = -(uint)(iVar26 < r_start);
    auVar29._8_4_ = -(uint)(iVar27 < r_start);
    auVar29._12_4_ = -(uint)(iVar28 < r_start);
    auVar31._0_4_ = -(uint)(iVar25 < r_end);
    auVar31._4_4_ = -(uint)(iVar26 < r_end);
    auVar31._8_4_ = -(uint)(iVar27 < r_end);
    auVar31._12_4_ = -(uint)(iVar28 < r_end);
    auVar1._8_4_ = 0xffffffff;
    auVar1._0_8_ = 0xffffffffffffffff;
    auVar1._12_4_ = 0xffffffff;
    auVar30._0_2_ = -(ushort)(-0x772d < (short)(sVar21 * -0x3dcb ^ 0x8000U));
    auVar30._2_2_ = -(ushort)(-0x772d < (short)(sVar21 * -0x3dcb ^ 0x8000U));
    auVar30._4_2_ = -(ushort)(-0x772d < (short)(sVar22 * -0x3dcb ^ 0x8000U));
    auVar30._6_2_ = -(ushort)(-0x772d < (short)(sVar22 * -0x3dcb ^ 0x8000U));
    auVar30._8_2_ = -(ushort)(-0x772d < (short)(sVar23 * -0x3dcb ^ 0x8000U));
    auVar30._10_2_ = -(ushort)(-0x772d < (short)(sVar23 * -0x3dcb ^ 0x8000U));
    auVar30._12_2_ = -(ushort)(-0x772d < (short)(sVar24 * -0x3dcb ^ 0x8000U));
    auVar30._14_2_ = -(ushort)(-0x772d < (short)(sVar24 * -0x3dcb ^ 0x8000U));
    auVar30 = auVar30 ^ (auVar31 ^ auVar1 | auVar29);
    iVar17 = iVar17 - auVar30._0_4_;
    iVar18 = iVar18 - auVar30._4_4_;
    iVar19 = iVar19 - auVar30._8_4_;
    iVar20 = iVar20 - auVar30._12_4_;
    iVar25 = iVar25 + 4;
    iVar26 = iVar26 + 4;
    iVar27 = iVar27 + 4;
    iVar28 = iVar28 + 4;
    sVar21 = sVar21 + 4;
    sVar22 = sVar22 + 4;
    sVar23 = sVar23 + 4;
    sVar24 = sVar24 + 4;
    iVar3 = iVar3 + -4;
  } while (iVar3 != 0);
  local_38 = (ulong)(uint)(iVar20 + iVar18 + iVar19 + iVar17);
  _Var2 = array_container_negation_range(container,r_start,r_end,&local_48);
  uVar14 = *local_48;
  _assert_int_equal((ulong)is_bitset,(ulong)_Var2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x596);
  _assert_int_equal(local_38,(long)(int)uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x597);
  uVar6 = 0;
LAB_001096f0:
  uVar14 = (uint)uVar6;
  uVar13 = (ushort)uVar6;
  uVar12 = (short)((uVar14 & 0xffff) / 0x1d) * 0x1d;
  if ((int)uVar14 < r_end && r_start <= (int)uVar14) {
    bVar16 = uVar13 != uVar12;
  }
  else {
    bVar16 = uVar13 == uVar12;
  }
  lVar5 = *(long *)(local_48 + 2);
  if (!_Var2) {
    uVar8 = 0;
    uVar7 = *local_48;
    do {
      iVar3 = uVar8 + 0x10;
      while( true ) {
        if ((int)uVar7 <= iVar3) {
          if ((int)uVar7 <= (int)uVar8) goto LAB_001097b2;
          uVar9 = (ulong)uVar8;
          goto LAB_0010979b;
        }
        uVar11 = (uVar7 - 1) + uVar8;
        uVar10 = uVar11 >> 1;
        uVar12 = *(ushort *)(lVar5 + (ulong)(uVar11 & 0xfffffffe));
        if (uVar13 <= uVar12) break;
        uVar8 = uVar10 + 1;
        iVar3 = uVar10 + 0x11;
      }
      uVar7 = uVar10;
    } while (uVar13 < uVar12);
LAB_0010978e:
    if (!bVar16) goto LAB_001097b7;
    goto LAB_001097d1;
  }
  if (bVar16 != ((*(ulong *)(lVar5 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0))
  goto LAB_001097b7;
  goto LAB_001097dc;
  while ((uVar12 <= uVar13 && (iVar3 = (int)uVar9, uVar9 = uVar9 + 1, uVar7 - 1 != iVar3))) {
LAB_0010979b:
    uVar12 = *(ushort *)(lVar5 + uVar9 * 2);
    if (uVar12 == uVar13) goto LAB_0010978e;
  }
LAB_001097b2:
  if (bVar16 != false) {
LAB_001097b7:
    printf("oops on %d\n",uVar6);
    lVar5 = *(long *)(local_48 + 2);
  }
LAB_001097d1:
  if (_Var2) {
LAB_001097dc:
    a = (unsigned_long)((*(ulong *)(lVar5 + (uVar6 >> 6) * 8) >> (uVar14 & 0x3f) & 1) != 0);
  }
  else {
    uVar8 = 0;
    uVar7 = *local_48;
    do {
      iVar3 = uVar8 + 0x10;
      while( true ) {
        if ((int)uVar7 <= iVar3) {
          if ((int)uVar7 <= (int)uVar8) goto LAB_00109852;
          uVar6 = (ulong)uVar8;
          goto LAB_00109834;
        }
        uVar10 = (uVar7 - 1) + uVar8;
        uVar11 = uVar10 >> 1;
        uVar12 = *(ushort *)(lVar5 + (ulong)(uVar10 & 0xfffffffe));
        if (uVar13 <= uVar12) break;
        uVar8 = uVar11 + 1;
        iVar3 = uVar11 + 0x11;
      }
      a = 1;
      uVar7 = uVar11;
    } while (uVar13 < uVar12);
  }
LAB_0010985b:
  _assert_int_equal(a,(ulong)bVar16,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x5a6);
  uVar6 = (ulong)(uVar14 + 1);
  if (uVar14 + 1 == 0x10000) {
    container_free(local_48,'\x02' - _Var2);
    array_container_free(container);
    return extraout_EAX;
  }
  goto LAB_001096f0;
  while( true ) {
    if (uVar13 <= uVar12 && uVar12 != uVar13) goto LAB_00109852;
    a = 0;
    iVar3 = (int)uVar6;
    uVar6 = uVar6 + 1;
    if (uVar7 - 1 == iVar3) break;
LAB_00109834:
    uVar12 = *(ushort *)(lVar5 + uVar6 * 2);
    if (uVar12 == uVar13) {
      a = 1;
      break;
    }
  }
  goto LAB_0010985b;
LAB_00109852:
  a = 0;
  goto LAB_0010985b;
}

Assistant:

static int array_negation_range_test(int r_start, int r_end, bool is_bitset) {
    bool result_is_bitset;
    int result_size_should_be = 0;

    array_container_t* AI = array_container_create();
    container_t* BO;  // bitset or array

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x >= r_start && x < r_end)
            if (x % 29 != 0)
                result_size_should_be++;
            else {
            }
        else if (x % 29 == 0)
            result_size_should_be++;
    }

    result_is_bitset = array_container_negation_range(AI, r_start, r_end, &BO);
    uint8_t result_typecode =
        (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(is_bitset, result_is_bitset);
    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
        bool should_be_present;
        if (x >= r_start && x < r_end)
            should_be_present = (x % 29 != 0);
        else
            should_be_present = (x % 29 == 0);

#ifndef UNVERBOSE_MIXED_CONTAINER
        if (should_be_present !=
            container_contains(BO, (uint16_t)x, result_typecode))
            printf("oops on %d\n", x);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         should_be_present);
    }
    container_free(BO, result_typecode);
    array_container_free(AI);
    return 1;
}